

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *pThis,Nwk_Vrt_t *pNext)

{
  int local_1c;
  int k;
  Nwk_Vrt_t *pNext_local;
  Nwk_Vrt_t *pThis_local;
  
  for (local_1c = 0; (local_1c < pThis->nEdges && ((&pThis[1].Id)[local_1c] != pNext->Id));
      local_1c = local_1c + 1) {
  }
  if (pThis->nEdges <= local_1c) {
    __assert_fail("k < pThis->nEdges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                  ,0x1bb,"void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *, Nwk_Vrt_t *)");
  }
  pThis->nEdges = pThis->nEdges + -1;
  for (; local_1c < pThis->nEdges; local_1c = local_1c + 1) {
    (&pThis[1].Id)[local_1c] = (&pThis[1].Id)[local_1c + 1];
  }
  return;
}

Assistant:

static inline void Nwk_ManGraphVertexRemoveEdge( Nwk_Vrt_t * pThis, Nwk_Vrt_t * pNext )
{
    int k;
    for ( k = 0; k < pThis->nEdges; k++ )
        if ( pThis->pEdges[k] == pNext->Id )
            break;
    assert( k < pThis->nEdges );
    pThis->nEdges--;
    for ( ; k < pThis->nEdges; k++ )
        pThis->pEdges[k] = pThis->pEdges[k+1];
}